

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O0

void __thiscall FuncInfo::ReleaseLoad(FuncInfo *this,ParseNode *pnode)

{
  ParseNode *pnode_local;
  FuncInfo *this_local;
  
  if ((pnode->nop - 0x2f < 2) || (pnode->nop == 0x3e)) {
    ReleaseReference(this,pnode);
  }
  ReleaseLoc(this,pnode);
  return;
}

Assistant:

void FuncInfo::ReleaseLoad(ParseNode *pnode)
{
    // Release any temp register(s) acquired by an EmitLoad.
    switch (pnode->nop)
    {
    case knopDot:
    case knopIndex:
    case knopCall:
        this->ReleaseReference(pnode);
        break;
    }
    this->ReleaseLoc(pnode);
}